

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::adjust_tree(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *this,size_t N,size_t NN)

{
  reference prVar1;
  reference prVar2;
  size_t sVar3;
  size_type sVar4;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *in_R8;
  size_t PP;
  type local_f8;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *local_d8;
  node_type *parent_;
  node_type *partner;
  node_type *node;
  undefined1 local_90 [8];
  node_type new_root;
  size_t NN_local;
  size_t N_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  
  new_root.box.radius.values_.elems[1] = (double)NN;
  NN_local = N;
  N_local = (size_t)this;
  prVar1 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(&this->tree_,N);
  if (prVar1->parent == 0xffffffffffffffff) {
    detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::rtree_node
              ((rtree_node<perior::point<double,_2UL>,_2UL,_6UL> *)local_90,false,0xffffffffffffffff
              );
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::push_back((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                 *)&new_root.parent,&NN_local);
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::push_back((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                 *)&new_root.parent,(unsigned_long *)(new_root.box.radius.values_.elems + 1));
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,NN_local);
    prVar2 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,(size_type)new_root.box.radius.values_.elems[1]);
    expand<perior::point<double,2ul>>
              ((type *)&node,(perior *)&prVar1->box,&prVar2->box,
               (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
    rectangle<perior::point<double,_2UL>_>::operator=
              ((rectangle<perior::point<double,_2UL>_> *)
               &new_root.entry.
                super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                .m_holder.m_size,(type *)&node);
    sVar3 = add_node(this,(node_type *)local_90);
    this->root_ = sVar3;
    sVar3 = this->root_;
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,NN_local);
    prVar1->parent = sVar3;
    sVar3 = this->root_;
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,(size_type)new_root.box.radius.values_.elems[1]);
    prVar1->parent = sVar3;
    detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::~rtree_node
              ((rtree_node<perior::point<double,_2UL>,_2UL,_6UL> *)local_90);
  }
  else {
    partner = boost::container::
              vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
              ::at(&this->tree_,NN_local);
    parent_ = boost::container::
              vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
              ::at(&this->tree_,(size_type)new_root.box.radius.values_.elems[1]);
    if (partner->parent != parent_->parent) {
      __assert_fail("node.parent == partner.parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                    ,0x110,
                    "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::adjust_tree(const std::size_t, const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                   );
    }
    local_d8 = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)boost::container::
                  vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                  ::at(&this->tree_,partner->parent);
    expand<perior::point<double,2ul>>
              (&local_f8,(perior *)((local_d8->boundary_).half_width_.values_.elems + 1),
               &partner->box,(rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
    rectangle<perior::point<double,_2UL>_>::operator=
              ((rectangle<perior::point<double,_2UL>_> *)
               ((local_d8->boundary_).half_width_.values_.elems + 1),&local_f8);
    this_local = local_d8;
    sVar4 = boost::container::
            vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            ::size((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                    *)&local_d8->boundary_);
    if (sVar4 < 6) {
      expand<perior::point<double,2ul>>
                ((type *)&PP,(perior *)((local_d8->boundary_).half_width_.values_.elems + 1),
                 &parent_->box,(rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
      rectangle<perior::point<double,_2UL>_>::operator=
                ((rectangle<perior::point<double,_2UL>_> *)
                 ((local_d8->boundary_).half_width_.values_.elems + 1),
                 (rectangle<perior::point<double,_2UL>_> *)&PP);
      boost::container::
      vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
      ::push_back((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                   *)&local_d8->boundary_,(unsigned_long *)(new_root.box.radius.values_.elems + 1));
      adjust_tree(this,partner->parent);
    }
    else {
      sVar3 = split_node(this,partner->parent,(size_t)new_root.box.radius.values_.elems[1]);
      adjust_tree(this,partner->parent,sVar3);
    }
  }
  return;
}

Assistant:

void adjust_tree(const std::size_t N, const std::size_t NN)
    {
        if(tree_.at(N).parent == nil) // grow tree taller
        {
            node_type new_root(false, nil);
            new_root.entry.push_back(N);
            new_root.entry.push_back(NN);
            new_root.box = expand(tree_.at(N).box, tree_.at(NN).box, this->boundary_);
            this->root_ = this->add_node(new_root);

            this->tree_.at(N).parent = this->root_;
            this->tree_.at(NN).parent = this->root_;
            return;
        }
        else
        {
            const node_type& node    = tree_.at(N);
            const node_type& partner = tree_.at(NN);
            assert(node.parent == partner.parent);

            node_type& parent_ = tree_.at(node.parent);
            parent_.box = expand(parent_.box, node.box, this->boundary_); // for N

            if(parent_.has_enough_storage())
            {
                parent_.box = expand(parent_.box, partner.box, this->boundary_); // for NN
                parent_.entry.push_back(NN);
                return this->adjust_tree(node.parent);
            }
            else
            {
                const std::size_t PP = this->split_node(node.parent, NN);
                return this->adjust_tree(node.parent, PP);
            }
        }
    }